

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QRegularExpression>::reallocateAndGrow
          (QArrayDataPointer<QRegularExpression> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QRegularExpression> *old)

{
  QRegularExpression *pQVar1;
  QRegularExpressionPrivate *pQVar2;
  Data *pDVar3;
  QRegularExpression *pQVar4;
  undefined1 *puVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  QRegularExpression *re;
  long in_FS_OFFSET;
  QArrayDataPointer<QRegularExpression> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<QRegularExpression> *)0x0 && where == GrowsAtEnd) {
    pDVar3 = this->d;
    if (pDVar3 == (Data *)0x0) {
      bVar6 = true;
    }
    else {
      bVar6 = 1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar6)) {
      if (pDVar3 == (Data *)0x0) {
        lVar7 = 0;
        lVar8 = 0;
      }
      else {
        lVar7 = (pDVar3->super_QArrayData).alloc;
        lVar8 = (this->size - (pDVar3->super_QArrayData).alloc) +
                ((long)((long)this->ptr -
                       ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
                >> 3);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        QtPrivate::QMovableArrayOps<QRegularExpression>::reallocate
                  ((QMovableArrayOps<QRegularExpression> *)this,lVar7 + n + lVar8,Grow);
        return;
      }
      goto LAB_00233a55;
    }
  }
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (QRegularExpression *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_48,this,n,where);
  pQVar4 = local_48.ptr;
  if ((n < 1) || (local_48.ptr != (QRegularExpression *)0x0)) {
    if (this->size != 0) {
      lVar7 = this->size + (n >> 0x3f & n);
      if (this->d == (Data *)0x0) {
        bVar6 = true;
      }
      else {
        bVar6 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      }
      re = this->ptr;
      pQVar1 = re + lVar7;
      if ((old != (QArrayDataPointer<QRegularExpression> *)0x0) || (bVar6)) {
        if ((lVar7 != 0) && (0 < lVar7)) {
          do {
            QRegularExpression::QRegularExpression(pQVar4 + local_48.size,re);
            re = re + 1;
            local_48.size = local_48.size + 1;
          } while (re < pQVar1);
        }
      }
      else if ((lVar7 != 0) && (0 < lVar7)) {
        do {
          pQVar2 = (re->d).d.ptr;
          (re->d).d.ptr = (QRegularExpressionPrivate *)0x0;
          local_48.ptr[local_48.size].d.d.ptr = pQVar2;
          re = re + 1;
          local_48.size = local_48.size + 1;
        } while (re < pQVar1);
      }
    }
    pDVar3 = this->d;
    pQVar4 = this->ptr;
    this->d = local_48.d;
    this->ptr = local_48.ptr;
    puVar5 = (undefined1 *)this->size;
    this->size = local_48.size;
    local_48.d = pDVar3;
    local_48.ptr = pQVar4;
    local_48.size = (qsizetype)puVar5;
    if (old != (QArrayDataPointer<QRegularExpression> *)0x0) {
      local_48.d = old->d;
      local_48.ptr = old->ptr;
      old->d = pDVar3;
      old->ptr = pQVar4;
      local_48.size = old->size;
      old->size = (qsizetype)puVar5;
    }
    ~QArrayDataPointer(&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    qBadAlloc();
  }
LAB_00233a55:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }